

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

Curl_hash_element * Curl_hash_next_element(Curl_hash_iterator *iter)

{
  Curl_hash *pCVar1;
  Curl_llist_node *pCVar2;
  Curl_hash_element *pCVar3;
  ulong uVar4;
  long lVar5;
  
  pCVar1 = iter->hash;
  if (pCVar1->table != (Curl_llist *)0x0) {
    if (iter->current_element != (Curl_llist_node *)0x0) {
      pCVar2 = Curl_node_next(iter->current_element);
      iter->current_element = pCVar2;
    }
    if ((iter->current_element == (Curl_llist_node *)0x0) &&
       (uVar4 = iter->slot_index, uVar4 < pCVar1->slots)) {
      lVar5 = uVar4 << 5;
      do {
        pCVar2 = Curl_llist_head((Curl_llist *)((long)&pCVar1->table->_head + lVar5));
        if (pCVar2 != (Curl_llist_node *)0x0) {
          pCVar2 = Curl_llist_head((Curl_llist *)((long)&pCVar1->table->_head + lVar5));
          iter->current_element = pCVar2;
          iter->slot_index = uVar4 + 1;
          break;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x20;
      } while (uVar4 < pCVar1->slots);
    }
    if (iter->current_element != (Curl_llist_node *)0x0) {
      pCVar3 = (Curl_hash_element *)Curl_node_elem(iter->current_element);
      return pCVar3;
    }
  }
  return (Curl_hash_element *)0x0;
}

Assistant:

struct Curl_hash_element *
Curl_hash_next_element(struct Curl_hash_iterator *iter)
{
  struct Curl_hash *h;
  DEBUGASSERT(iter->init == ITERINIT);
  h = iter->hash;
  if(!h->table)
    return NULL; /* empty hash, nothing to return */

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = Curl_node_next(iter->current_element);

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    size_t i;
    for(i = iter->slot_index; i < h->slots; i++) {
      if(Curl_llist_head(&h->table[i])) {
        iter->current_element = Curl_llist_head(&h->table[i]);
        iter->slot_index = i + 1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct Curl_hash_element *he = Curl_node_elem(iter->current_element);
    return he;
  }
  return NULL;
}